

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServerProtocol.cxx
# Opt level: O1

bool __thiscall
cmServerProtocol1::DoActivate(cmServerProtocol1 *this,cmServerRequest *request,string *errorMessage)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmake *this_00;
  cmState *state;
  bool bVar2;
  Value *pVVar3;
  long *plVar4;
  __normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
  _Var5;
  undefined8 *puVar6;
  size_type *psVar7;
  string *psVar8;
  string *psVar9;
  __normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
  __it;
  __normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
  __first;
  undefined8 uVar10;
  _Alloc_hider _Var11;
  __normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
  _Var12;
  long lVar13;
  Value *this_01;
  __normal_iterator<cmake::GeneratorInfo_*,_std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>_>
  __last;
  anon_class_16_2_b7cf16a7_for__M_pred __pred;
  string cachePath;
  string generator;
  string buildDirectory;
  string extraGenerator;
  string sourceDirectory;
  string platform;
  string toolset;
  vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> generators;
  string local_240;
  undefined1 local_220 [32];
  GeneratorInfo *local_200;
  GeneratorInfo *local_1f8;
  GeneratorInformation local_1f0;
  string *local_130;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_01 = &request->Data;
  pVVar3 = Json::Value::operator[](this_01,&kSOURCE_DIRECTORY_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_(&local_c8,pVVar3);
  pVVar3 = Json::Value::operator[](this_01,&kBUILD_DIRECTORY_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_(&local_108,pVVar3);
  pVVar3 = Json::Value::operator[](this_01,&kGENERATOR_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_(&local_128,pVVar3);
  pVVar3 = Json::Value::operator[](this_01,&kEXTRA_GENERATOR_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_(&local_e8,pVVar3);
  pVVar3 = Json::Value::operator[](this_01,&kTOOLSET_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_(&local_88,pVVar3);
  pVVar3 = Json::Value::operator[](this_01,&kPLATFORM_KEY_abi_cxx11_);
  Json::Value::asString_abi_cxx11_(&local_a8,pVVar3);
  if (local_108._M_string_length == 0) {
    local_220._0_8_ = local_220 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"\"","");
    plVar4 = (long *)std::__cxx11::string::_M_append
                               (local_220,(ulong)kBUILD_DIRECTORY_KEY_abi_cxx11_._M_dataplus._M_p);
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    psVar7 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_240.field_2._M_allocated_capacity = *psVar7;
      local_240.field_2._8_8_ = plVar4[3];
    }
    else {
      local_240.field_2._M_allocated_capacity = *psVar7;
      local_240._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_240._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_240);
    local_1f0.GeneratorName._M_dataplus._M_p = (pointer)&local_1f0.GeneratorName.field_2;
    psVar8 = (string *)(puVar6 + 2);
    if ((string *)*puVar6 == psVar8) {
      local_1f0.GeneratorName.field_2._M_allocated_capacity = (size_type)(psVar8->_M_dataplus)._M_p;
      local_1f0.GeneratorName.field_2._8_8_ = puVar6[3];
    }
    else {
      local_1f0.GeneratorName.field_2._M_allocated_capacity = (size_type)(psVar8->_M_dataplus)._M_p;
      local_1f0.GeneratorName._M_dataplus._M_p = (pointer)*puVar6;
    }
    local_1f0.GeneratorName._M_string_length = puVar6[1];
    *puVar6 = psVar8;
    puVar6[1] = 0;
    *(undefined1 *)(puVar6 + 2) = 0;
    if (errorMessage != (string *)0x0) {
      std::__cxx11::string::_M_assign((string *)errorMessage);
    }
    goto LAB_0046b86d;
  }
  this_00 = (this->super_cmServerProtocol).m_CMakeInstance._M_t.
            super___uniq_ptr_impl<cmake,_std::default_delete<cmake>_>._M_t.
            super__Tuple_impl<0UL,_cmake_*,_std::default_delete<cmake>_>.
            super__Head_base<0UL,_cmake_*,_false>._M_head_impl;
  bVar2 = cmsys::SystemTools::PathExists(&local_108);
  if (bVar2) {
    bVar2 = cmsys::SystemTools::FileIsDirectory(&local_108);
    if (!bVar2) {
      local_220._0_8_ = local_220 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"\"","");
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append
                         (local_220,(ulong)kBUILD_DIRECTORY_KEY_abi_cxx11_._M_dataplus._M_p);
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      psVar7 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_240.field_2._M_allocated_capacity = *psVar7;
        local_240.field_2._8_8_ = puVar6[3];
      }
      else {
        local_240.field_2._M_allocated_capacity = *psVar7;
        local_240._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_240._M_string_length = puVar6[1];
      *puVar6 = psVar7;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_240);
      local_1f0.GeneratorName._M_dataplus._M_p = (pointer)&local_1f0.GeneratorName.field_2;
      psVar8 = (string *)(puVar6 + 2);
      if ((string *)*puVar6 == psVar8) {
        local_1f0.GeneratorName.field_2._M_allocated_capacity =
             (size_type)(psVar8->_M_dataplus)._M_p;
        local_1f0.GeneratorName.field_2._8_8_ = puVar6[3];
      }
      else {
        local_1f0.GeneratorName.field_2._M_allocated_capacity =
             (size_type)(psVar8->_M_dataplus)._M_p;
        local_1f0.GeneratorName._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_1f0.GeneratorName._M_string_length = puVar6[1];
      *puVar6 = psVar8;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      if (errorMessage != (string *)0x0) {
        std::__cxx11::string::_M_assign((string *)errorMessage);
      }
      goto LAB_0046b86d;
    }
    cmake::FindCacheFile(&local_1f0.GeneratorName,&local_108);
    bVar2 = cmake::LoadCache(this_00,&local_1f0.GeneratorName);
    if (!bVar2) {
LAB_0046b1c2:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0.GeneratorName._M_dataplus._M_p != &local_1f0.GeneratorName.field_2) {
        operator_delete(local_1f0.GeneratorName._M_dataplus._M_p,
                        (ulong)(local_1f0.GeneratorName.field_2._M_allocated_capacity + 1));
      }
      goto LAB_0046b1dd;
    }
    state = this_00->State;
    local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"CMAKE_GENERATOR","");
    local_220._0_8_ = local_220 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"generator","");
    bVar2 = testValue(state,&local_240,&local_128,(string *)local_220,errorMessage);
    if ((string *)local_220._0_8_ != (string *)(local_220 + 0x10)) {
      operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    if (bVar2) {
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_240,"CMAKE_EXTRA_GENERATOR","");
      local_220._0_8_ = local_220 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"extra generator","");
      bVar2 = testValue(state,&local_240,&local_e8,(string *)local_220,errorMessage);
      if ((string *)local_220._0_8_ != (string *)(local_220 + 0x10)) {
        operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240._M_dataplus._M_p != &local_240.field_2) {
        operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
      }
      if ((bVar2) && (bVar2 = testHomeDirectory(state,&local_c8,errorMessage), bVar2)) {
        local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_240,"CMAKE_GENERATOR_TOOLSET","");
        local_220._0_8_ = local_220 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"toolset","");
        bVar2 = testValue(state,&local_240,&local_88,(string *)local_220,errorMessage);
        if ((string *)local_220._0_8_ != (string *)(local_220 + 0x10)) {
          operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_240._M_dataplus._M_p != &local_240.field_2) {
          operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
        }
        if (bVar2) {
          local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_240,"CMAKE_GENERATOR_PLATFORM","");
          local_220._0_8_ = local_220 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"platform","");
          bVar2 = testValue(state,&local_240,&local_a8,(string *)local_220,errorMessage);
          if ((string *)local_220._0_8_ != (string *)(local_220 + 0x10)) {
            operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_240._M_dataplus._M_p != &local_240.field_2) {
            operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
          }
          if (bVar2) goto LAB_0046b1c2;
        }
      }
    }
    uVar10 = local_1f0.GeneratorName.field_2._M_allocated_capacity;
    _Var11._M_p = local_1f0.GeneratorName._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.GeneratorName._M_dataplus._M_p != &local_1f0.GeneratorName.field_2)
    goto LAB_0046b8aa;
  }
  else {
LAB_0046b1dd:
    if (local_c8._M_string_length == 0) {
      local_220._0_8_ = local_220 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"\"","");
      puVar6 = (undefined8 *)
               std::__cxx11::string::_M_append
                         (local_220,(ulong)kSOURCE_DIRECTORY_KEY_abi_cxx11_._M_dataplus._M_p);
      local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
      psVar7 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar7) {
        local_240.field_2._M_allocated_capacity = *psVar7;
        local_240.field_2._8_8_ = puVar6[3];
      }
      else {
        local_240.field_2._M_allocated_capacity = *psVar7;
        local_240._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_240._M_string_length = puVar6[1];
      *puVar6 = psVar7;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_240);
      local_1f0.GeneratorName._M_dataplus._M_p = (pointer)&local_1f0.GeneratorName.field_2;
      psVar8 = (string *)(puVar6 + 2);
      if ((string *)*puVar6 == psVar8) {
        local_1f0.GeneratorName.field_2._M_allocated_capacity =
             (size_type)(psVar8->_M_dataplus)._M_p;
        local_1f0.GeneratorName.field_2._8_8_ = puVar6[3];
      }
      else {
        local_1f0.GeneratorName.field_2._M_allocated_capacity =
             (size_type)(psVar8->_M_dataplus)._M_p;
        local_1f0.GeneratorName._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_1f0.GeneratorName._M_string_length = puVar6[1];
      *puVar6 = psVar8;
      puVar6[1] = 0;
      *(undefined1 *)(puVar6 + 2) = 0;
      if (errorMessage != (string *)0x0) {
        std::__cxx11::string::_M_assign((string *)errorMessage);
      }
    }
    else {
      bVar2 = cmsys::SystemTools::FileIsDirectory(&local_c8);
      if (bVar2) {
        if (local_128._M_string_length != 0) {
          local_68.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
          _M_impl.super__Vector_impl_data._M_start = (GeneratorInfo *)0x0;
          local_68.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
          _M_impl.super__Vector_impl_data._M_finish = (GeneratorInfo *)0x0;
          local_68.super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_130 = errorMessage;
          cmake::GetRegisteredGenerators(this_00,&local_68);
          lVar13 = ((long)local_68.
                          super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_68.
                          super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x4ec4ec4ec4ec4ec5 >> 2;
          _Var5._M_current =
               local_68.
               super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
          __first._M_current =
               local_68.
               super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
               _M_impl.super__Vector_impl_data._M_start;
          __last._M_current =
               local_68.
               super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          local_1f0.GeneratorName._M_dataplus._M_p = (pointer)&local_128;
          if (0 < lVar13) {
            local_1f8 = local_68.
                        super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
            _Var5._M_current =
                 local_68.
                 super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start + lVar13 * 4;
            lVar13 = lVar13 + 1;
            local_200 = local_68.
                        super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>
                        ._M_impl.super__Vector_impl_data._M_start;
            __it._M_current =
                 local_68.
                 super__Vector_base<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>.
                 _M_impl.super__Vector_impl_data._M_start;
            do {
              bVar2 = __gnu_cxx::__ops::
                      _Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::$_0>
                      ::operator()((_Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::__0>
                                    *)&local_1f0,__it);
              __first._M_current = local_200;
              _Var12._M_current = __it._M_current;
              __last._M_current = local_1f8;
              if (bVar2) goto LAB_0046b99b;
              bVar2 = __gnu_cxx::__ops::
                      _Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::$_0>
                      ::operator()((_Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::__0>
                                    *)&local_1f0,__it._M_current + 1);
              __first._M_current = local_200;
              _Var12._M_current = __it._M_current + 1;
              __last._M_current = local_1f8;
              if (bVar2) goto LAB_0046b99b;
              bVar2 = __gnu_cxx::__ops::
                      _Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::$_0>
                      ::operator()((_Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::__0>
                                    *)&local_1f0,__it._M_current + 2);
              __first._M_current = local_200;
              _Var12._M_current = __it._M_current + 2;
              __last._M_current = local_1f8;
              if (bVar2) goto LAB_0046b99b;
              bVar2 = __gnu_cxx::__ops::
                      _Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::$_0>
                      ::operator()((_Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::__0>
                                    *)&local_1f0,__it._M_current + 3);
              __first._M_current = local_200;
              _Var12._M_current = __it._M_current + 3;
              __last._M_current = local_1f8;
              if (bVar2) goto LAB_0046b99b;
              __it._M_current = __it._M_current + 4;
              lVar13 = lVar13 + -1;
            } while (1 < lVar13);
          }
          lVar13 = ((long)__last._M_current - (long)_Var5._M_current >> 3) * 0x4ec4ec4ec4ec4ec5;
          if (lVar13 == 1) {
LAB_0046b362:
            bVar2 = __gnu_cxx::__ops::
                    _Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::$_0>
                    ::operator()((_Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::__0>
                                  *)&local_1f0,_Var5);
            _Var12._M_current = _Var5._M_current;
            if (!bVar2) {
              _Var12._M_current = __last._M_current;
            }
          }
          else if (lVar13 == 2) {
LAB_0046b34d:
            bVar2 = __gnu_cxx::__ops::
                    _Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::$_0>
                    ::operator()((_Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::__0>
                                  *)&local_1f0,_Var5);
            _Var12._M_current = _Var5._M_current;
            if (!bVar2) {
              _Var5._M_current = _Var5._M_current + 1;
              goto LAB_0046b362;
            }
          }
          else {
            _Var12._M_current = __last._M_current;
            if ((lVar13 == 3) &&
               (bVar2 = __gnu_cxx::__ops::
                        _Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::$_0>
                        ::operator()((_Iter_pred<cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::__0>
                                      *)&local_1f0,_Var5), _Var12._M_current = _Var5._M_current,
               !bVar2)) {
              _Var5._M_current = _Var5._M_current + 1;
              goto LAB_0046b34d;
            }
          }
LAB_0046b99b:
          if (_Var12._M_current == __last._M_current) {
            local_220._0_8_ = (string *)(local_220 + 0x10);
            std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"Generator \"","");
            psVar8 = local_130;
            std::operator+(&local_240,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_220,&local_128);
            puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_240);
            paVar1 = &local_1f0.GeneratorName.field_2;
            psVar9 = (string *)(puVar6 + 2);
            if ((string *)*puVar6 == psVar9) {
              local_1f0.GeneratorName.field_2._M_allocated_capacity =
                   (size_type)(psVar9->_M_dataplus)._M_p;
              local_1f0.GeneratorName.field_2._8_8_ = puVar6[3];
              local_1f0.GeneratorName._M_dataplus._M_p = (pointer)paVar1;
            }
            else {
              local_1f0.GeneratorName.field_2._M_allocated_capacity =
                   (size_type)(psVar9->_M_dataplus)._M_p;
              local_1f0.GeneratorName._M_dataplus._M_p = (pointer)*puVar6;
            }
            local_1f0.GeneratorName._M_string_length = puVar6[1];
            *puVar6 = psVar9;
            puVar6[1] = 0;
            *(undefined1 *)(puVar6 + 2) = 0;
            if (psVar8 != (string *)0x0) {
              std::__cxx11::string::_M_assign((string *)psVar8);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1f0.GeneratorName._M_dataplus._M_p != paVar1) {
              operator_delete(local_1f0.GeneratorName._M_dataplus._M_p,
                              (ulong)(local_1f0.GeneratorName.field_2._M_allocated_capacity + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_240._M_dataplus._M_p != &local_240.field_2) {
              operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1
                             );
            }
            local_50.field_2._M_allocated_capacity = local_220._16_8_;
            local_50._M_dataplus._M_p = (pointer)local_220._0_8_;
            if ((string *)local_220._0_8_ == (string *)(local_220 + 0x10)) goto LAB_0046bd4f;
LAB_0046bd47:
            operator_delete(local_50._M_dataplus._M_p,
                            (ulong)(local_50.field_2._M_allocated_capacity + 1));
LAB_0046bd4f:
            bVar2 = false;
          }
          else {
            __pred.extraGenerator = &local_e8;
            __pred.generator = &local_128;
            _Var5 = std::
                    find_if<__gnu_cxx::__normal_iterator<cmake::GeneratorInfo*,std::vector<cmake::GeneratorInfo,std::allocator<cmake::GeneratorInfo>>>,cmServerProtocol1::DoActivate(cmServerRequest_const&,std::__cxx11::string*)::__1>
                              (__first,__last,__pred);
            psVar8 = local_130;
            if (_Var5._M_current == __last._M_current) {
              std::operator+(&local_50,"The combination of generator \"",&local_128);
              puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_50);
              psVar9 = (string *)(puVar6 + 2);
              if ((string *)*puVar6 == psVar9) {
                local_220._16_8_ = (psVar9->_M_dataplus)._M_p;
                local_220._24_8_ = puVar6[3];
                local_220._0_8_ = (string *)(local_220 + 0x10);
              }
              else {
                local_220._16_8_ = (psVar9->_M_dataplus)._M_p;
                local_220._0_8_ = (string *)*puVar6;
              }
              local_220._8_8_ = puVar6[1];
              *puVar6 = psVar9;
              puVar6[1] = 0;
              *(undefined1 *)(puVar6 + 2) = 0;
              std::operator+(&local_240,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_220,&local_e8);
              puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_240);
              paVar1 = &local_1f0.GeneratorName.field_2;
              psVar9 = (string *)(puVar6 + 2);
              if ((string *)*puVar6 == psVar9) {
                local_1f0.GeneratorName.field_2._M_allocated_capacity =
                     (size_type)(psVar9->_M_dataplus)._M_p;
                local_1f0.GeneratorName.field_2._8_8_ = puVar6[3];
                local_1f0.GeneratorName._M_dataplus._M_p = (pointer)paVar1;
              }
              else {
                local_1f0.GeneratorName.field_2._M_allocated_capacity =
                     (size_type)(psVar9->_M_dataplus)._M_p;
                local_1f0.GeneratorName._M_dataplus._M_p = (pointer)*puVar6;
              }
              local_1f0.GeneratorName._M_string_length = puVar6[1];
              *puVar6 = psVar9;
              puVar6[1] = 0;
              *(undefined1 *)(puVar6 + 2) = 0;
              if (psVar8 != (string *)0x0) {
                std::__cxx11::string::_M_assign((string *)psVar8);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f0.GeneratorName._M_dataplus._M_p != paVar1) {
                operator_delete(local_1f0.GeneratorName._M_dataplus._M_p,
                                (ulong)(local_1f0.GeneratorName.field_2._M_allocated_capacity + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_240._M_dataplus._M_p != &local_240.field_2) {
                operator_delete(local_240._M_dataplus._M_p,
                                local_240.field_2._M_allocated_capacity + 1);
              }
              if ((string *)local_220._0_8_ != (string *)(local_220 + 0x10)) {
                operator_delete((void *)local_220._0_8_,(ulong)(local_220._16_8_ + 1));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) goto LAB_0046bd47;
              goto LAB_0046bd4f;
            }
            if (((_Var5._M_current)->supportsToolset == false) && (local_88._M_string_length != 0))
            {
              local_1f0.GeneratorName._M_dataplus._M_p = (pointer)&local_1f0.GeneratorName.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1f0,
                         "Toolset was provided but is not supported by the requested generator.","")
              ;
              if (psVar8 != (string *)0x0) {
                std::__cxx11::string::_M_assign((string *)psVar8);
              }
LAB_0046bb4e:
              local_50.field_2._M_allocated_capacity =
                   local_1f0.GeneratorName.field_2._M_allocated_capacity;
              local_50._M_dataplus._M_p = local_1f0.GeneratorName._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1f0.GeneratorName._M_dataplus._M_p != &local_1f0.GeneratorName.field_2)
              goto LAB_0046bd47;
              goto LAB_0046bd4f;
            }
            if (((_Var5._M_current)->supportsPlatform == false) && (local_a8._M_string_length != 0))
            {
              local_1f0.GeneratorName._M_dataplus._M_p = (pointer)&local_1f0.GeneratorName.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_1f0,
                         "Platform was provided but is not supported by the requested generator.",""
                        );
              if (psVar8 != (string *)0x0) {
                std::__cxx11::string::_M_assign((string *)psVar8);
              }
              goto LAB_0046bb4e;
            }
            GeneratorInformation::GeneratorInformation
                      (&local_1f0,&local_128,&local_e8,&local_88,&local_a8,&local_c8,&local_108);
            GeneratorInformation::operator=(&this->GeneratorInfo,&local_1f0);
            GeneratorInformation::~GeneratorInformation(&local_1f0);
            this->m_State = STATE_ACTIVE;
            bVar2 = true;
          }
          std::vector<cmake::GeneratorInfo,_std::allocator<cmake::GeneratorInfo>_>::~vector
                    (&local_68);
          goto LAB_0046b8b4;
        }
        local_220._0_8_ = local_220 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"\"","");
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           (local_220,(ulong)kGENERATOR_KEY_abi_cxx11_._M_dataplus._M_p);
        local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
        psVar7 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_240.field_2._M_allocated_capacity = *psVar7;
          local_240.field_2._8_8_ = puVar6[3];
        }
        else {
          local_240.field_2._M_allocated_capacity = *psVar7;
          local_240._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_240._M_string_length = puVar6[1];
        *puVar6 = psVar7;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_240);
        local_1f0.GeneratorName._M_dataplus._M_p = (pointer)&local_1f0.GeneratorName.field_2;
        psVar8 = (string *)(puVar6 + 2);
        if ((string *)*puVar6 == psVar8) {
          local_1f0.GeneratorName.field_2._M_allocated_capacity =
               (size_type)(psVar8->_M_dataplus)._M_p;
          local_1f0.GeneratorName.field_2._8_8_ = puVar6[3];
        }
        else {
          local_1f0.GeneratorName.field_2._M_allocated_capacity =
               (size_type)(psVar8->_M_dataplus)._M_p;
          local_1f0.GeneratorName._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_1f0.GeneratorName._M_string_length = puVar6[1];
        *puVar6 = psVar8;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        if (errorMessage != (string *)0x0) {
          std::__cxx11::string::_M_assign((string *)errorMessage);
        }
      }
      else {
        local_220._0_8_ = local_220 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"\"","");
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           (local_220,(ulong)kSOURCE_DIRECTORY_KEY_abi_cxx11_._M_dataplus._M_p);
        local_240._M_dataplus._M_p = (pointer)&local_240.field_2;
        psVar7 = puVar6 + 2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar6 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar7) {
          local_240.field_2._M_allocated_capacity = *psVar7;
          local_240.field_2._8_8_ = puVar6[3];
        }
        else {
          local_240.field_2._M_allocated_capacity = *psVar7;
          local_240._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_240._M_string_length = puVar6[1];
        *puVar6 = psVar7;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        puVar6 = (undefined8 *)std::__cxx11::string::append((char *)&local_240);
        local_1f0.GeneratorName._M_dataplus._M_p = (pointer)&local_1f0.GeneratorName.field_2;
        psVar8 = (string *)(puVar6 + 2);
        if ((string *)*puVar6 == psVar8) {
          local_1f0.GeneratorName.field_2._M_allocated_capacity =
               (size_type)(psVar8->_M_dataplus)._M_p;
          local_1f0.GeneratorName.field_2._8_8_ = puVar6[3];
        }
        else {
          local_1f0.GeneratorName.field_2._M_allocated_capacity =
               (size_type)(psVar8->_M_dataplus)._M_p;
          local_1f0.GeneratorName._M_dataplus._M_p = (pointer)*puVar6;
        }
        local_1f0.GeneratorName._M_string_length = puVar6[1];
        *puVar6 = psVar8;
        puVar6[1] = 0;
        *(undefined1 *)(puVar6 + 2) = 0;
        if (errorMessage != (string *)0x0) {
          std::__cxx11::string::_M_assign((string *)errorMessage);
        }
      }
    }
LAB_0046b86d:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0.GeneratorName._M_dataplus._M_p != &local_1f0.GeneratorName.field_2) {
      operator_delete(local_1f0.GeneratorName._M_dataplus._M_p,
                      (ulong)(local_1f0.GeneratorName.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    uVar10 = local_220._16_8_;
    _Var11._M_p = (pointer)local_220._0_8_;
    if ((string *)local_220._0_8_ != (string *)(local_220 + 0x10)) {
LAB_0046b8aa:
      operator_delete(_Var11._M_p,(ulong)(uVar10 + 1));
    }
  }
  bVar2 = false;
LAB_0046b8b4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool cmServerProtocol1::DoActivate(const cmServerRequest& request,
                                   std::string* errorMessage)
{
  std::string sourceDirectory = request.Data[kSOURCE_DIRECTORY_KEY].asString();
  const std::string buildDirectory =
    request.Data[kBUILD_DIRECTORY_KEY].asString();
  std::string generator = request.Data[kGENERATOR_KEY].asString();
  std::string extraGenerator = request.Data[kEXTRA_GENERATOR_KEY].asString();
  std::string toolset = request.Data[kTOOLSET_KEY].asString();
  std::string platform = request.Data[kPLATFORM_KEY].asString();

  if (buildDirectory.empty()) {
    setErrorMessage(errorMessage, std::string("\"") + kBUILD_DIRECTORY_KEY +
                      "\" is missing.");
    return false;
  }

  cmake* cm = CMakeInstance();
  if (cmSystemTools::PathExists(buildDirectory)) {
    if (!cmSystemTools::FileIsDirectory(buildDirectory)) {
      setErrorMessage(errorMessage, std::string("\"") + kBUILD_DIRECTORY_KEY +
                        "\" exists but is not a directory.");
      return false;
    }

    const std::string cachePath = cm->FindCacheFile(buildDirectory);
    if (cm->LoadCache(cachePath)) {
      cmState* state = cm->GetState();

      // Check generator:
      if (!testValue(state, "CMAKE_GENERATOR", generator, "generator",
                     errorMessage)) {
        return false;
      }

      // check extra generator:
      if (!testValue(state, "CMAKE_EXTRA_GENERATOR", extraGenerator,
                     "extra generator", errorMessage)) {
        return false;
      }

      // check sourcedir:
      if (!testHomeDirectory(state, sourceDirectory, errorMessage)) {
        return false;
      }

      // check toolset:
      if (!testValue(state, "CMAKE_GENERATOR_TOOLSET", toolset, "toolset",
                     errorMessage)) {
        return false;
      }

      // check platform:
      if (!testValue(state, "CMAKE_GENERATOR_PLATFORM", platform, "platform",
                     errorMessage)) {
        return false;
      }
    }
  }

  if (sourceDirectory.empty()) {
    setErrorMessage(errorMessage, std::string("\"") + kSOURCE_DIRECTORY_KEY +
                      "\" is unset but required.");
    return false;
  }
  if (!cmSystemTools::FileIsDirectory(sourceDirectory)) {
    setErrorMessage(errorMessage, std::string("\"") + kSOURCE_DIRECTORY_KEY +
                      "\" is not a directory.");
    return false;
  }
  if (generator.empty()) {
    setErrorMessage(errorMessage, std::string("\"") + kGENERATOR_KEY +
                      "\" is unset but required.");
    return false;
  }

  std::vector<cmake::GeneratorInfo> generators;
  cm->GetRegisteredGenerators(generators);
  auto baseIt = std::find_if(generators.begin(), generators.end(),
                             [&generator](const cmake::GeneratorInfo& info) {
                               return info.name == generator;
                             });
  if (baseIt == generators.end()) {
    setErrorMessage(errorMessage, std::string("Generator \"") + generator +
                      "\" not supported.");
    return false;
  }
  auto extraIt = std::find_if(
    generators.begin(), generators.end(),
    [&generator, &extraGenerator](const cmake::GeneratorInfo& info) {
      return info.baseName == generator && info.extraName == extraGenerator;
    });
  if (extraIt == generators.end()) {
    setErrorMessage(errorMessage,
                    std::string("The combination of generator \"" + generator +
                                "\" and extra generator \"" + extraGenerator +
                                "\" is not supported."));
    return false;
  }
  if (!extraIt->supportsToolset && !toolset.empty()) {
    setErrorMessage(errorMessage,
                    std::string("Toolset was provided but is not supported by "
                                "the requested generator."));
    return false;
  }
  if (!extraIt->supportsPlatform && !platform.empty()) {
    setErrorMessage(errorMessage,
                    std::string("Platform was provided but is not supported "
                                "by the requested generator."));
    return false;
  }

  this->GeneratorInfo =
    GeneratorInformation(generator, extraGenerator, toolset, platform,
                         sourceDirectory, buildDirectory);

  this->m_State = STATE_ACTIVE;
  return true;
}